

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O3

LogStream * __thiscall tt::LogStream::operator<<(LogStream *this,char *str)

{
  char *pcVar1;
  size_t __n;
  char **ppcVar2;
  
  if (str == (char *)0x0) {
    pcVar1 = (this->m_buffer).m_cur;
    if (((int)this + 0xfa8) - (int)pcVar1 < 7) {
      return this;
    }
    builtin_strncpy(pcVar1,"(null)",6);
    __n = 6;
  }
  else {
    __n = strlen(str);
    pcVar1 = (this->m_buffer).m_cur;
    if (((int)this + 0xfa8) - (int)pcVar1 <= (int)__n) {
      return this;
    }
    memcpy(pcVar1,str,__n);
  }
  ppcVar2 = &(this->m_buffer).m_cur;
  *ppcVar2 = *ppcVar2 + __n;
  return this;
}

Assistant:

LogStream& operator<<(const char* str){
		if(str){
			m_buffer.append(str,strlen(str));
		}else{
			m_buffer.append("(null)",6);
		}

		return *this;
	}